

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

bool __thiscall Functions::findFunction(Functions *this,Function *function)

{
  pointer ppFVar1;
  pointer ppFVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  string findFID;
  string stackFID;
  vector<Function_*,_std::allocator<Function_*>_> local_88;
  vector<Function_*,_std::allocator<Function_*>_> local_68;
  long *local_50;
  pointer local_48;
  long local_40 [2];
  
  if (function != (Function *)0x0) {
    std::vector<Function_*,_std::allocator<Function_*>_>::vector(&local_88,&this->_functionStack);
    ppFVar2 = local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppFVar1 = local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (ppFVar1 != ppFVar2) {
      uVar3 = 0;
      do {
        uVar5 = uVar3;
        std::vector<Function_*,_std::allocator<Function_*>_>::vector
                  (&local_88,&this->_functionStack);
        ppFVar2 = local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        ppFVar1 = local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar6 = (long)ppFVar2 - (long)ppFVar1 >> 3;
        if (uVar6 <= uVar5) {
          return false;
        }
        (*(function->super_Statement)._vptr_Statement[3])(&local_88,function);
        std::vector<Function_*,_std::allocator<Function_*>_>::vector
                  (&local_68,&this->_functionStack);
        (*(local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar5]->super_Statement)._vptr_Statement[3])(&local_50);
        if (local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.super__Vector_base<Function_*,_std::allocator<Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
            super__Vector_impl_data._M_finish == local_48) {
          if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
              super__Vector_impl_data._M_finish == (pointer)0x0) {
            bVar7 = true;
          }
          else {
            iVar4 = bcmp(local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                         _M_impl.super__Vector_impl_data._M_start,local_50,
                         (size_t)local_88.
                                 super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl
                                 .super__Vector_impl_data._M_finish);
            bVar7 = iVar4 == 0;
          }
        }
        else {
          bVar7 = false;
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.super__Vector_base<Function_*,_std::allocator<Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        uVar3 = uVar5 + 1;
      } while (!bVar7);
      if (uVar5 < uVar6) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Functions::findFunction(Function *function) {
    if(function == nullptr) return false;
    if(!getFunctionStack().empty()) {
        for (int i = 0; i < getFunctionStack().size(); i++) {
            std::string findFID = function->id();
            std::string stackFID = getFunctionStack()[i]->id();
            if (findFID == stackFID) {
                return true;
            }
        }
    }
    return false;
}